

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O1

void mathCore::do_expansion(expression *a,expression *expandTo,expression *expandFrom)

{
  expression *peVar1;
  bool bVar2;
  iterator iVar3;
  _Rb_tree_header *p_Var4;
  expression *peVar5;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  expression *child;
  expSet tempSet;
  expression *local_78;
  expression *local_70;
  _Alloc_node local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  bVar2 = is_and(a);
  local_70 = expandTo;
  if (bVar2) {
    bVar2 = is_DNF(expandTo);
    if (!bVar2) {
      return;
    }
    bVar2 = is_sum(expandFrom);
    if (!bVar2) {
      return;
    }
    distributive_law(a,expandTo,expandFrom);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar3._M_node = (expandTo->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(expandTo->contents)._M_t._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)iVar3._M_node != p_Var4) {
      do {
        local_78 = *(expression **)(iVar3._M_node + 1);
        iVar3 = std::
                _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                    *)&expandTo->contents,iVar3._M_node);
        do_simplification(local_78);
        pVar6 = std::
                _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                ::_M_get_insert_equal_pos(&local_60,&local_78);
        local_68._M_t = &local_60;
        std::
        _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
        ::
        _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                  ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                    *)&local_60,pVar6.first,pVar6.second,&local_78,&local_68);
      } while ((_Rb_tree_header *)iVar3._M_node != p_Var4);
    }
    peVar5 = (expression *)&local_60;
    mergeMultiSet(&expandTo->contents,(expSet *)peVar5);
    peVar1 = local_70;
    idempotent_law((mathCore *)local_70,peVar5);
    universal_bound(peVar1);
  }
  else {
    bVar2 = is_or(a);
    if (!bVar2) {
      return;
    }
    bVar2 = is_CNF(expandTo);
    if (!bVar2) {
      return;
    }
    bVar2 = is_product(expandFrom);
    if (!bVar2) {
      return;
    }
    distributive_law(a,expandTo,expandFrom);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar3._M_node = (expandTo->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(expandTo->contents)._M_t._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)iVar3._M_node != p_Var4) {
      do {
        local_78 = *(expression **)(iVar3._M_node + 1);
        iVar3 = std::
                _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                    *)&expandTo->contents,iVar3._M_node);
        do_simplification(local_78);
        pVar6 = std::
                _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                ::_M_get_insert_equal_pos(&local_60,&local_78);
        local_68._M_t = &local_60;
        std::
        _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
        ::
        _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                  ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                    *)&local_60,pVar6.first,pVar6.second,&local_78,&local_68);
      } while ((_Rb_tree_header *)iVar3._M_node != p_Var4);
    }
    peVar5 = (expression *)&local_60;
    mergeMultiSet(&expandTo->contents,(expSet *)peVar5);
    peVar1 = local_70;
    idempotent_law((mathCore *)local_70,peVar5);
    universal_bound(peVar1);
  }
  std::
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void mathCore::do_expansion(expression* a, expression* expandTo, expression* expandFrom) {
	if (is_and(a)) {
		// (ABC+DEF)(X+Y)
		// (ABC(X+Y) + DEF(X+Y))
		if (is_DNF(expandTo) && is_sum(expandFrom)) {
			distributive_law(a, expandTo, expandFrom);
			
			expSet tempSet;
			auto iter = expandTo->contents.begin();
			expression* child;

			while (iter != expandTo->contents.end()) {
				child = *iter;
				iter = expandTo->contents.erase(iter);


				do_simplification(child);
				tempSet.insert(child);
			}
			mergeMultiSet(expandTo->contents, tempSet);
			idempotent_law(expandTo);
			universal_bound(expandTo);
		}
	}
	else if (is_or(a)) {
		// (A+B+C)(D+E+F) + (ABCD)
		// (A+B+C+ABCD)(D+E+F+ABCD)
		if (is_CNF(expandTo) && is_product(expandFrom)) {
			distributive_law(a, expandTo, expandFrom);

			expSet tempSet;
			auto iter = expandTo->contents.begin();
			expression* child;

			while (iter != expandTo->contents.end()) {
				child = *iter;
				iter = expandTo->contents.erase(iter);
				do_simplification(child);
				tempSet.insert(child);
			}
			mergeMultiSet(expandTo->contents, tempSet);
			idempotent_law(expandTo);
			universal_bound(expandTo);
		}
	}
}